

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_analyzer.cc
# Opt level: O2

void __thiscall AnalyzerDecl::GenInitCode(AnalyzerDecl *this,Output *out_cc)

{
  AnalyzerHelperList *pAVar1;
  pointer ppAVar2;
  
  TypeDecl::GenInitCode(&this->super_TypeDecl,out_cc);
  pAVar1 = this->constructor_helpers_;
  if (pAVar1 != (AnalyzerHelperList *)0x0) {
    for (ppAVar2 = (pAVar1->super__Vector_base<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>)
                   ._M_impl.super__Vector_impl_data._M_start;
        ppAVar2 !=
        (pAVar1->super__Vector_base<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>)._M_impl.
        super__Vector_impl_data._M_finish; ppAVar2 = ppAVar2 + 1) {
      AnalyzerHelper::GenCode(*ppAVar2,(Output *)0x0,out_cc,this);
      pAVar1 = this->constructor_helpers_;
    }
  }
  return;
}

Assistant:

void AnalyzerDecl::GenInitCode(Output* out_cc)
	{
	TypeDecl::GenInitCode(out_cc);
	foreach (i, AnalyzerHelperList, constructor_helpers_)
		{
		(*i)->GenCode(nullptr, out_cc, this);
		}
	}